

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O3

void __thiscall nv::ColorBlock::diameterRange(ColorBlock *this,Color32 *start,Color32 *end)

{
  anon_union_4_2_12391d8d_for_Color32_0 aVar1;
  anon_union_4_2_12391d8d_for_Color32_0 aVar2;
  anon_union_4_2_12391d8d_for_Color32_0 aVar3;
  ulong uVar4;
  int iVar5;
  anon_union_4_2_12391d8d_for_Color32_0 in_R9D;
  anon_union_4_2_12391d8d_for_Color32_0 in_R10D;
  uint uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  
  uVar4 = 0;
  lVar7 = 1;
  uVar6 = 0;
  do {
    if (uVar4 < 0xf) {
      aVar1 = (anon_union_4_2_12391d8d_for_Color32_0)this->m_color[uVar4].field_0.u;
      lVar8 = lVar7;
      do {
        aVar2 = (anon_union_4_2_12391d8d_for_Color32_0)this->m_color[lVar8].field_0.u;
        iVar11 = (aVar1.u >> 0x10 & 0xff) - (aVar2.u >> 0x10 & 0xff);
        iVar5 = (aVar1.u >> 8 & 0xff) - (aVar2.u >> 8 & 0xff);
        iVar9 = (aVar1.u & 0xff) - (aVar2.u & 0xff);
        uVar10 = iVar9 * iVar9 + iVar11 * iVar11 + iVar5 * iVar5;
        aVar3 = aVar1;
        if (uVar10 <= uVar6) {
          uVar10 = uVar6;
          aVar3 = in_R10D;
          aVar2 = in_R9D;
        }
        in_R9D = aVar2;
        in_R10D = aVar3;
        uVar6 = uVar10;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x10);
    }
    uVar4 = uVar4 + 1;
    lVar7 = lVar7 + 1;
  } while (uVar4 != 0x10);
  start->field_0 = in_R10D;
  end->field_0 = in_R9D;
  return;
}

Assistant:

void ColorBlock::diameterRange(Color32 * start, Color32 * end) const
{
	nvDebugCheck(start != NULL);
	nvDebugCheck(end != NULL);
	
	Color32 c0, c1;
	uint best_dist = 0;
	
	for(int i = 0; i < 16; i++) {
		for (int j = i+1; j < 16; j++) {
			uint dist = colorDistance(m_color[i], m_color[j]);
			if( dist > best_dist ) {
				best_dist = dist;
				c0 = m_color[i];
				c1 = m_color[j];
			}
		}
	}
	
	*start = c0;
	*end = c1;
}